

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

SubDFriendlyKnotType
ON_SubD::NurbsKnotType(int order,int cv_count,double *knots,ON_SimpleArray<double> *triple_knots)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  SubDFriendlyKnotType SVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  char cVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar8;
  
  if ((triple_knots != (ON_SimpleArray<double> *)0x0) && (-1 < triple_knots->m_capacity)) {
    triple_knots->m_count = 0;
  }
  SVar4 = Unfriendly;
  if ((order == 4) && (knots != (double *)0x0 && 3 < cv_count)) {
    dVar12 = knots[3] - knots[2];
    if (0.0 < dVar12) {
      bVar6 = *knots == knots[1] && knots[2] == knots[1];
      uVar5 = cv_count - 1;
      dVar11 = knots[(uint)cv_count];
      if ((knots[uVar5] != dVar11) || (NAN(knots[uVar5]) || NAN(dVar11))) {
        bVar2 = false;
      }
      else {
        bVar2 = dVar11 == knots[(ulong)(uint)cv_count + 1];
      }
      if (bVar6 == true && triple_knots != (ON_SimpleArray<double> *)0x0) {
        ON_SimpleArray<double>::Append(triple_knots,knots + 2);
      }
      dVar11 = dVar12 * 1.490116119385e-08;
      bVar6 = (bool)(bVar6 & bVar2);
      bVar3 = false;
      if ((((!bVar6) && (ABS((knots[1] - *knots) - dVar12) <= dVar11)) &&
          (ABS((knots[2] - knots[1]) - dVar12) <= dVar11)) &&
         (ABS((knots[(uint)cv_count] - knots[uVar5]) - dVar12) <= dVar11)) {
        bVar3 = ABS((knots[(ulong)(uint)cv_count + 1] - knots[(uint)cv_count]) - dVar12) <= dVar11;
      }
      if (bVar3 != bVar6) {
        cVar9 = '\0';
        iVar7 = 3;
        while (iVar7 < (int)uVar5) {
          dVar1 = knots[iVar7];
          dVar10 = knots[(long)iVar7 + 1] - dVar1;
          if ((dVar10 != 0.0) || (NAN(dVar10))) {
            iVar8 = iVar7;
            if (dVar11 < ABS(dVar10 - dVar12)) {
              return Unfriendly;
            }
          }
          else {
            if (bVar6 == false) {
              return Unfriendly;
            }
            if (knots[(long)iVar7 + 2] != dVar1) {
              return Unfriendly;
            }
            if (NAN(knots[(long)iVar7 + 2]) || NAN(dVar1)) {
              return Unfriendly;
            }
            cVar9 = '\x01';
            iVar8 = iVar7 + 1;
            if (triple_knots != (ON_SimpleArray<double> *)0x0) {
              ON_SimpleArray<double>::Append(triple_knots,knots + (long)iVar7 + 1);
            }
          }
          iVar7 = iVar8 + 1;
        }
        if (bVar2 && triple_knots != (ON_SimpleArray<double> *)0x0) {
          ON_SimpleArray<double>::Append(triple_knots,knots + uVar5);
        }
        SVar4 = UnclampedUniform;
        if (bVar6 != false) {
          SVar4 = cVar9 * '\x02' + ClampedUniform;
        }
      }
    }
  }
  return SVar4;
}

Assistant:

ON_SubD::SubDFriendlyKnotType ON_SubD::NurbsKnotType(
    int order,
    int cv_count,
    const double* knots,
    ON_SimpleArray<double>* triple_knots
  )
{
  if (nullptr != triple_knots)
    triple_knots->SetCount(0);
  for (;;)
  {
    if (4 != order || cv_count < order || nullptr == knots)
      break;

    const double delta = knots[3] - knots[2];
    if (false == (delta > 0.0))
      break;

    const double deltatol = ON_SQRT_EPSILON * delta;

    const bool bClamped0 = knots[0] == knots[1] && knots[1] == knots[2];
    const bool bClamped1 = knots[cv_count - 1] == knots[cv_count] && knots[cv_count] == knots[cv_count + 1];
    if (bClamped0 && nullptr != triple_knots)
      triple_knots->Append(knots[2]);

    const bool bClamped = bClamped0 && bClamped1;
    const bool bUnclamped =
      (false == bClamped)
      && fabs(knots[1] - knots[0] - delta) <= deltatol
      && fabs(knots[2] - knots[1] - delta) <= deltatol
      && fabs(knots[cv_count] - knots[cv_count - 1] - delta) <= deltatol
      && fabs(knots[cv_count + 1] - knots[cv_count] - delta) <= deltatol
      ;
    if ( bClamped == bUnclamped)
      break;

    bool bPiecewiseUniform = false;
    for (int knot_dex = 3; knot_dex < cv_count - 1; ++knot_dex)
    {
      const double d = knots[knot_dex + 1] - knots[knot_dex];
      if (0.0 == d)
      {
        if (bClamped && knots[knot_dex + 2] == knots[knot_dex])
        {
          bPiecewiseUniform = true;
          ++knot_dex;
          if (bClamped1 && nullptr != triple_knots)
            triple_knots->Append(knots[knot_dex]);
          continue;
        }
      }
      else
      {
        if (fabs(d - delta) <= deltatol)
          continue;
      }
      return ON_SubD::SubDFriendlyKnotType::Unfriendly;
    }

    if (bClamped1 && nullptr != triple_knots)
      triple_knots->Append(knots[cv_count - 1]);

    return
      bClamped
      ? (bPiecewiseUniform ? ON_SubD::SubDFriendlyKnotType::ClampedPiecewiseUniform : ON_SubD::SubDFriendlyKnotType::ClampedUniform)
      : ON_SubD::SubDFriendlyKnotType::UnclampedUniform;
  }

  return ON_SubD::SubDFriendlyKnotType::Unfriendly;
}